

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O2

ssize_t __thiscall
merlin::graphical_model::read(graphical_model *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  istream *piVar5;
  size_t j;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  size_t ncliques;
  double fval;
  char local_134;
  size_t nval;
  size_t csize;
  size_t nvar;
  vector<merlin::factor,_std::allocator<merlin::factor>_> factors;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> sets;
  vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
  cliques;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dims;
  size_t v;
  string st;
  string err_msg;
  
  piVar5 = (istream *)CONCAT44(in_register_00000034,__fd);
  st._M_dataplus._M_p = (pointer)&st.field_2;
  st._M_string_length = 0;
  st.field_2._M_local_buf[0] = '\0';
  std::operator>>(piVar5,(string *)&st);
  iVar2 = std::__cxx11::string::compare((char *)&st);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&st);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&err_msg,"Merlin only supports the UAI Markov or Bayes file format.",
                 (allocator *)&dims);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(string *)&err_msg);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = false;
  }
  this->m_markov = bVar1;
  std::istream::_M_extract<unsigned_long>((ulong *)piVar5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&dims,nvar,(allocator_type *)&err_msg);
  for (uVar7 = 0; uVar7 < nvar; uVar7 = uVar7 + 1) {
    std::istream::_M_extract<unsigned_long>((ulong *)piVar5);
  }
  std::istream::_M_extract<unsigned_long>((ulong *)piVar5);
  std::
  vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
  ::vector(&cliques,ncliques,(allocator_type *)&err_msg);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::vector
            (&sets,ncliques,(allocator_type *)&err_msg);
  uVar7 = 0;
  while( true ) {
    if (ncliques <= uVar7) break;
    std::istream::_M_extract<unsigned_long>((ulong *)piVar5);
    std::vector<merlin::variable,_std::allocator<merlin::variable>_>::reserve
              (cliques.
               super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7,csize);
    for (uVar6 = 0; uVar6 < csize; uVar6 = uVar6 + 1) {
      std::istream::_M_extract<unsigned_long>((ulong *)piVar5);
      err_msg._M_string_length =
           dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[v];
      std::vector<merlin::variable,_std::allocator<merlin::variable>_>::push_back
                (cliques.
                 super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7,(value_type *)&err_msg);
      variable_set::operator|=
                (sets.
                 super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar7,(variable *)&err_msg);
    }
    uVar7 = uVar7 + 1;
  }
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
            (&factors,ncliques,(allocator_type *)&err_msg);
  uVar7 = 0;
  while( true ) {
    if (ncliques <= uVar7) {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator=
                (&this->m_factors,&factors);
      fixup(this);
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&factors);
      std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&sets);
      std::
      vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
      ::~vector(&cliques);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      sVar4 = std::__cxx11::string::~string((string *)&st);
      return sVar4;
    }
    std::istream::_M_extract<unsigned_long>((ulong *)piVar5);
    sVar3 = variable_set::num_states
                      (sets.
                       super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar7);
    if (nval != sVar3) break;
    factor::factor((factor *)&err_msg,
                   sets.
                   super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar7,0.0);
    factor::operator=(factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar7,(factor *)&err_msg);
    factor::~factor((factor *)&err_msg);
    if (this->m_markov == false) {
      factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7].c_ =
           (int)cliques.
                super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar7].
                super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].m_label;
    }
    convert_index::convert_index
              ((convert_index *)&err_msg,
               cliques.
               super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7,false,true);
    for (uVar6 = 0; uVar6 < nval; uVar6 = uVar6 + 1) {
      sVar3 = convert_index::convert((convert_index *)&err_msg,uVar6);
      std::istream::_M_extract<double>((double *)piVar5);
      local_134 = (char)__buf;
      if (local_134 != '\0') {
        if ((fval != 0.0) || (NAN(fval))) {
          if ((fval == 1.0) && (!NAN(fval))) {
            fval = 0.999999;
          }
        }
        else {
          fval = fval + 1e-06;
        }
      }
      factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7].t_.super__Vector_base<double,_std::allocator<double>_>
      ._M_impl.super__Vector_impl_data._M_start[sVar3] = fval;
    }
    convert_index::~convert_index((convert_index *)&err_msg);
    uVar7 = uVar7 + 1;
  }
  __assert_fail("nval == sets[i].num_states()",
                "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/graphical_model.h"
                ,0xb1,"void merlin::graphical_model::read(std::istream &, bool)");
}

Assistant:

void read(std::istream& is, bool positive_mode = false) {

		// Read the header
		size_t nvar, ncliques, csize, v, nval;
		std::string st;
		is >> st;
		if ( st.compare("MARKOV") == 0 ) {
			m_markov = true;
		} else if ( st.compare("BAYES") == 0 ) {
			m_markov = false;
		} else {
			std::string err_msg("Merlin only supports the UAI Markov or Bayes file format.");
			throw std::runtime_error(err_msg);
		}

		// Read the number of variables and their domains
		is >> nvar;
		std::vector<size_t> dims(nvar);
		for (size_t i = 0; i < nvar; i++)
			is >> dims[i];

		// Read the number of factors and their scopes (scope is a variable_set)
		is >> ncliques;
		std::vector<std::vector<variable> > cliques(ncliques);
		std::vector<variable_set> sets(ncliques);
		for (size_t i = 0; i < ncliques; i++) {
			is >> csize;
			cliques[i].reserve(csize);
			for (size_t j = 0; j < csize; j++) {
				is >> v;
				variable V(v, dims[v]);
				cliques[i].push_back(V);
				sets[i] |= V;
			}
		}

		// Read the factor tables (ensure conversion to ordered scopes)
		double fval;
		std::vector<factor> factors(ncliques);
		for (size_t i = 0; i < ncliques; i++) {
			is >> nval;
			assert(nval == sets[i].num_states());
			factors[i] = factor(sets[i], 0.0); // preallocate memory
			if (m_markov == false) { // for Bayes nets, last variable is the child
				factors[i].set_child(cliques[i].back().label());
			}
			convert_index ci(cliques[i], false, true); // convert from source order (littleEndian) to target order (bigEndian)
			for (size_t j = 0; j < nval; j++) {
				size_t k = ci.convert(j);	// get the index in the factor table
				is >> fval; // read the factor value;
				if (positive_mode) { // force positive values (> 0) if enabled
					if (fval == 0.0) {
						fval += MERLIN_EPSILON; // adjust slightly for numerical stability
					} else if (fval == 1.0) {
						fval -= MERLIN_EPSILON; // adjust slightly for numerical stability
					}
				}

				factors[i][k] = fval; // save the factor value into the table
			}
		}

		m_factors = factors;
		fixup();
	}